

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# HTMLtree.c
# Opt level: O0

int htmlNodeDumpFileFormat(FILE *out,xmlDocPtr doc,xmlNodePtr cur,char *encoding,int format)

{
  xmlCharEncodingHandler *encoder;
  xmlOutputBufferPtr buf_00;
  int ret;
  xmlCharEncodingHandlerPtr handler;
  xmlOutputBufferPtr buf;
  int format_local;
  char *encoding_local;
  xmlNodePtr cur_local;
  xmlDocPtr doc_local;
  FILE *out_local;
  
  xmlInitParser();
  encoder = htmlFindOutputEncoder(encoding);
  buf_00 = xmlOutputBufferCreateFile(out,encoder);
  if (buf_00 == (xmlOutputBufferPtr)0x0) {
    out_local._4_4_ = 0;
  }
  else {
    htmlNodeDumpFormatOutput(buf_00,doc,cur,(char *)0x0,format);
    out_local._4_4_ = xmlOutputBufferClose(buf_00);
  }
  return out_local._4_4_;
}

Assistant:

int
htmlNodeDumpFileFormat(FILE *out, xmlDocPtr doc,
	               xmlNodePtr cur, const char *encoding, int format) {
    xmlOutputBufferPtr buf;
    xmlCharEncodingHandlerPtr handler;
    int ret;

    xmlInitParser();

    /*
     * save the content to a temp buffer.
     */
    handler = htmlFindOutputEncoder(encoding);
    buf = xmlOutputBufferCreateFile(out, handler);
    if (buf == NULL)
        return(0);

    htmlNodeDumpFormatOutput(buf, doc, cur, NULL, format);

    ret = xmlOutputBufferClose(buf);
    return(ret);
}